

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O0

void __thiscall
Assimp::IFC::Schema_2x3::IfcEllipseProfileDef::IfcEllipseProfileDef(IfcEllipseProfileDef *this)

{
  IfcEllipseProfileDef *this_local;
  
  STEP::Object::Object((Object *)&this->field_0x90,"IfcEllipseProfileDef");
  IfcParameterizedProfileDef::IfcParameterizedProfileDef
            (&this->super_IfcParameterizedProfileDef,&PTR_construction_vtable_24__00f9ea00);
  STEP::ObjectHelper<Assimp::IFC::Schema_2x3::IfcEllipseProfileDef,_2UL>::ObjectHelper
            ((ObjectHelper<Assimp::IFC::Schema_2x3::IfcEllipseProfileDef,_2UL> *)
             &(this->super_IfcParameterizedProfileDef).field_0x70,
             &PTR_construction_vtable_24__00f9ea48);
  (this->super_IfcParameterizedProfileDef).super_IfcProfileDef.
  super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcProfileDef,_2UL>._vptr_ObjectHelper =
       (_func_int **)0xf9e970;
  *(undefined8 *)&this->field_0x90 = 0xf9e9e8;
  *(undefined8 *)&(this->super_IfcParameterizedProfileDef).super_IfcProfileDef.field_0x58 = 0xf9e998
  ;
  *(undefined8 *)&(this->super_IfcParameterizedProfileDef).field_0x70 = 0xf9e9c0;
  return;
}

Assistant:

IfcEllipseProfileDef() : Object("IfcEllipseProfileDef") {}